

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O3

int npf_parse_format_spec(char *format,npf_format_spec_t *out_spec)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  char cVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  char *cur;
  uint8_t uVar8;
  
  out_spec->left_justified = '\0';
  out_spec->leading_zero_pad = '\0';
  out_spec->case_adjust = ' ';
  out_spec->prepend = '\0';
  out_spec->alt_form = '\0';
  cVar4 = '\x01';
  pbVar3 = (byte *)format;
  bVar2 = 0;
LAB_0010b541:
  while( true ) {
    while( true ) {
      pbVar5 = pbVar3 + 1;
      bVar1 = *pbVar5;
      if (bVar1 < 0x2b) break;
      if (bVar1 == 0x30) {
        out_spec->leading_zero_pad = cVar4;
        pbVar3 = pbVar5;
      }
      else {
        if (bVar1 == 0x2b) goto LAB_0010b58a;
        if (bVar1 != 0x2d) goto LAB_0010b593;
        out_spec->left_justified = '-';
        out_spec->leading_zero_pad = '\0';
        cVar4 = '\0';
        pbVar3 = pbVar5;
      }
    }
    if (bVar1 != 0x20) break;
    pbVar3 = pbVar5;
    if (bVar2 == 0) {
LAB_0010b58a:
      out_spec->prepend = bVar1;
      pbVar3 = pbVar5;
      bVar2 = bVar1;
    }
  }
  if (bVar1 == 0x23) {
    out_spec->alt_form = '#';
    pbVar3 = pbVar5;
    goto LAB_0010b541;
  }
LAB_0010b593:
  out_spec->field_width = 0;
  out_spec->field_width_opt = '\0';
  if (*pbVar5 == 0x2a) {
    out_spec->field_width_opt = '\x02';
    pbVar5 = pbVar3 + 2;
  }
  else if ((byte)(*pbVar5 - 0x30) < 10) {
    iVar6 = 0;
    pbVar3 = pbVar5;
    do {
      out_spec->field_width_opt = '\x01';
      pbVar5 = pbVar3 + 1;
      iVar6 = (int)(char)*pbVar3 + iVar6 * 10 + -0x30;
      out_spec->field_width = iVar6;
      pbVar7 = pbVar3 + 1;
      pbVar3 = pbVar5;
    } while ((byte)(*pbVar7 - 0x30) < 10);
  }
  out_spec->prec = 0;
  out_spec->prec_opt = '\0';
  if (*pbVar5 == 0x2e) {
    if (pbVar5[1] == 0x2d) {
      pbVar5 = pbVar5 + 2;
      cVar4 = '\0';
    }
    else {
      if (pbVar5[1] == 0x2a) {
        out_spec->prec_opt = '\x02';
        pbVar5 = pbVar5 + 2;
        cVar4 = '\x02';
        goto LAB_0010b652;
      }
      pbVar5 = pbVar5 + 1;
      out_spec->prec_opt = '\x01';
      cVar4 = '\x01';
    }
    bVar2 = *pbVar5;
    if ((byte)(bVar2 - 0x30) < 10) {
      iVar6 = 0;
      do {
        iVar6 = (uint)(byte)(bVar2 - 0x30) + iVar6 * 10;
        out_spec->prec = iVar6;
        bVar2 = pbVar5[1];
        pbVar5 = pbVar5 + 1;
      } while ((byte)(bVar2 - 0x30) < 10);
    }
  }
  else {
    cVar4 = '\0';
  }
LAB_0010b652:
  out_spec->length_modifier = '\0';
  pbVar3 = pbVar5 + 1;
  bVar2 = *pbVar5;
  if (bVar2 == 0x4c) {
    out_spec->length_modifier = '\x02';
LAB_0010b694:
    bVar2 = *pbVar3;
    pbVar7 = pbVar3;
  }
  else {
    if (bVar2 == 0x6c) {
      out_spec->length_modifier = '\x04';
      goto LAB_0010b694;
    }
    pbVar7 = pbVar5;
    if (bVar2 == 0x68) {
      out_spec->length_modifier = '\x01';
      bVar2 = *pbVar3;
      pbVar7 = pbVar3;
      if (bVar2 == 0x68) {
        out_spec->length_modifier = '\x03';
        pbVar3 = pbVar5 + 2;
        goto LAB_0010b694;
      }
    }
  }
  uVar8 = '\a';
  iVar6 = 0;
  switch(bVar2) {
  case 0x58:
    out_spec->case_adjust = '\0';
    break;
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_0010b6bd_caseD_59;
  case 0x61:
    goto switchD_0010b6bd_caseD_61;
  case 0x62:
switchD_0010b6bd_caseD_62:
    out_spec->conv_spec = '\x05';
    goto LAB_0010b75f;
  case 99:
    out_spec->conv_spec = '\x02';
    goto LAB_0010b717;
  case 100:
  case 0x69:
    uVar8 = '\x04';
    break;
  case 0x65:
switchD_0010b6bd_caseD_65:
    out_spec->conv_spec = '\f';
    goto LAB_0010b754;
  case 0x66:
switchD_0010b6bd_caseD_66:
    out_spec->conv_spec = '\v';
    goto LAB_0010b754;
  case 0x67:
switchD_0010b6bd_caseD_67:
    out_spec->conv_spec = '\r';
    goto LAB_0010b754;
  case 0x6e:
    out_spec->conv_spec = '\n';
    goto LAB_0010b717;
  case 0x6f:
    uVar8 = '\x06';
    break;
  case 0x70:
    out_spec->conv_spec = '\t';
LAB_0010b717:
    out_spec->prec_opt = '\0';
    goto LAB_0010b75f;
  case 0x73:
    out_spec->conv_spec = '\x03';
    goto LAB_0010b728;
  case 0x75:
    uVar8 = '\b';
    break;
  case 0x78:
    break;
  default:
    iVar6 = 0;
    switch(bVar2) {
    case 0x41:
      out_spec->case_adjust = '\0';
      break;
    case 0x42:
      out_spec->case_adjust = '\0';
      goto switchD_0010b6bd_caseD_62;
    case 0x43:
    case 0x44:
      goto switchD_0010b6bd_caseD_59;
    case 0x45:
      out_spec->case_adjust = '\0';
      goto switchD_0010b6bd_caseD_65;
    case 0x46:
      out_spec->case_adjust = '\0';
      goto switchD_0010b6bd_caseD_66;
    case 0x47:
      out_spec->case_adjust = '\0';
      goto switchD_0010b6bd_caseD_67;
    default:
      if (bVar2 != 0x25) {
        return 0;
      }
      out_spec->conv_spec = '\x01';
      goto LAB_0010b717;
    }
    goto switchD_0010b6bd_caseD_61;
  }
  out_spec->conv_spec = uVar8;
  if (cVar4 != '\0') {
LAB_0010b728:
    out_spec->leading_zero_pad = '\0';
  }
LAB_0010b75f:
  iVar6 = ((int)pbVar7 + 1) - (int)format;
switchD_0010b6bd_caseD_59:
  return iVar6;
switchD_0010b6bd_caseD_61:
  out_spec->conv_spec = '\x0e';
LAB_0010b754:
  if (cVar4 == '\0') {
    out_spec->prec = 6;
  }
  goto LAB_0010b75f;
}

Assistant:

static int npf_parse_format_spec(char const *format, npf_format_spec_t *out_spec) {
  char const *cur = format;

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
  out_spec->left_justified = 0;
  out_spec->leading_zero_pad = 0;
#endif
  out_spec->case_adjust = 'a' - 'A'; // lowercase
  out_spec->prepend = 0;
  out_spec->alt_form = 0;

  while (*++cur) { // cur points at the leading '%' character
    switch (*cur) { // Optional flags
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
      case '-': out_spec->left_justified = '-'; out_spec->leading_zero_pad = 0; continue;
      case '0': out_spec->leading_zero_pad = !out_spec->left_justified; continue;
#endif
      case '+': out_spec->prepend = '+'; continue;
      case ' ': if (out_spec->prepend == 0) { out_spec->prepend = ' '; } continue;
      case '#': out_spec->alt_form = '#'; continue;
      default: break;
    }
    break;
  }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
  out_spec->field_width = 0;
  out_spec->field_width_opt = NPF_FMT_SPEC_OPT_NONE;
  if (*cur == '*') {
    out_spec->field_width_opt = NPF_FMT_SPEC_OPT_STAR;
    ++cur;
  } else {
    while ((*cur >= '0') && (*cur <= '9')) {
      out_spec->field_width_opt = NPF_FMT_SPEC_OPT_LITERAL;
      out_spec->field_width = (out_spec->field_width * 10) + (*cur++ - '0');
    }
  }
#endif

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
  out_spec->prec = 0;
  out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
  if (*cur == '.') {
    ++cur;
    if (*cur == '*') {
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_STAR;
      ++cur;
    } else {
      if (*cur == '-') {
        ++cur;
      } else {
        out_spec->prec_opt = NPF_FMT_SPEC_OPT_LITERAL;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        out_spec->prec = (out_spec->prec * 10) + (*cur++ - '0');
      }
    }
  }
#endif

  uint_fast8_t tmp_conv = NPF_FMT_SPEC_CONV_NONE;
  out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_NONE;
  switch (*cur++) { // Length modifier
    case 'h':
      out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_SHORT;
      if (*cur == 'h') {
        out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_CHAR;
        ++cur;
      }
      break;
    case 'l':
      out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LONG;
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
      if (*cur == 'l') {
        out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_LONG_LONG;
        ++cur;
      }
#endif
      break;
#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
    case 'L': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LONG_DOUBLE; break;
#endif
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
    case 'j': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_INTMAX; break;
    case 'z': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_SIZET; break;
    case 't': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_PTRDIFFT; break;
#endif
    default: --cur; break;
  }

  switch (*cur++) { // Conversion specifier
    case '%': out_spec->conv_spec = NPF_FMT_SPEC_CONV_PERCENT;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

    case 'c': out_spec->conv_spec = NPF_FMT_SPEC_CONV_CHAR;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

    case 's': out_spec->conv_spec = NPF_FMT_SPEC_CONV_STRING;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
      out_spec->leading_zero_pad = 0;
#endif
      break;

    case 'i':
    case 'd': tmp_conv = NPF_FMT_SPEC_CONV_SIGNED_INT;
    case 'o':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_OCTAL; }
    case 'u':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_UNSIGNED_INT; }
    case 'X':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { out_spec->case_adjust = 0; }
    case 'x':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_HEX_INT; }
      out_spec->conv_spec = (uint8_t)tmp_conv;
#if (NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1) && \
    (NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1)
      if (out_spec->prec_opt != NPF_FMT_SPEC_OPT_NONE) { out_spec->leading_zero_pad = 0; }
#endif
      break;

#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
    case 'F': out_spec->case_adjust = 0;
    case 'f':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_DEC;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'E': out_spec->case_adjust = 0;
    case 'e':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_SCI;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'G': out_spec->case_adjust = 0;
    case 'g':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_SHORTEST;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'A': out_spec->case_adjust = 0;
    case 'a':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_HEX;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;
#endif

#if NANOPRINTF_USE_WRITEBACK_FORMAT_SPECIFIERS == 1
    case 'n':
      // todo: reject string if flags or width or precision exist
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_WRITEBACK;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;
#endif

    case 'p':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_POINTER;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
    case 'B':
      out_spec->case_adjust = 0;
    case 'b':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_BINARY;
      break;
#endif

    default: return 0;
  }

  return (int)(cur - format);
}